

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O3

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,void **vtt)

{
  _func_int **pp_Var1;
  ITexture *pIVar2;
  _func_int *p_Var3;
  void *pvVar4;
  pointer pEVar5;
  code *pcVar6;
  pointer ppIVar7;
  pointer ppIVar8;
  ulong uVar9;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IRenderTarget)._vptr_IRenderTarget = pp_Var1;
  *(void **)((long)&(this->super_IRenderTarget)._vptr_IRenderTarget + (long)pp_Var1[-3]) = vtt[3];
  if ((this->ColorAttachment != 0) && (this->BufferID != 0)) {
    pcVar6 = *(code **)&this->Driver->field_0x900;
    if ((pcVar6 != (code *)0x0) ||
       (pcVar6 = *(code **)&this->Driver->field_0x958, pcVar6 != (code *)0x0)) {
      (*pcVar6)(1,&this->BufferID);
    }
  }
  ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar8 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppIVar8 - (long)ppIVar7) >> 3) != 0) {
    uVar9 = 0;
    do {
      pIVar2 = ppIVar7[uVar9];
      if (pIVar2 != (ITexture *)0x0) {
        p_Var3 = pIVar2->_vptr_ITexture[0xfffffffffffffffd];
        pcVar6 = p_Var3 + 8 + (long)&(pIVar2->NamedPath).Path;
        *(int *)pcVar6 = *(int *)pcVar6 + -1;
        if (*(int *)pcVar6 == 0) {
          (**(code **)(*(long *)((long)&pIVar2->_vptr_ITexture + (long)p_Var3) + 8))();
          ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppIVar8 = (this->super_IRenderTarget).Textures.m_data.
                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((ulong)((long)ppIVar8 - (long)ppIVar7) >> 3 & 0xffffffff));
  }
  pIVar2 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar2 != (ITexture *)0x0) {
    p_Var3 = pIVar2->_vptr_ITexture[-3];
    pcVar6 = p_Var3 + 8 + (long)&(pIVar2->NamedPath).Path;
    *(int *)pcVar6 = *(int *)pcVar6 + -1;
    if (*(int *)pcVar6 == 0) {
      (**(code **)(*(long *)((long)&pIVar2->_vptr_ITexture + (long)p_Var3) + 8))();
    }
  }
  pvVar4 = *(void **)&(this->super_IRenderTarget).field_0x58;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&(this->super_IRenderTarget).field_0x68 - (long)pvVar4);
  }
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IRenderTarget)._vptr_IRenderTarget = pp_Var1;
  *(void **)((long)&(this->super_IRenderTarget)._vptr_IRenderTarget + (long)pp_Var1[-3]) = vtt[2];
  pEVar5 = (this->super_IRenderTarget).CubeSurfaces.m_data.
           super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar5 != (pointer)0x0) {
    operator_delete(pEVar5,(long)(this->super_IRenderTarget).CubeSurfaces.m_data.
                                 super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar5);
  }
  ppIVar7 = (this->super_IRenderTarget).Textures.m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar7 != (pointer)0x0) {
    operator_delete(ppIVar7,(long)(this->super_IRenderTarget).Textures.m_data.
                                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar7
                   );
    return;
  }
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}